

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  int *piVar1;
  ushort uVar2;
  Pgno PVar3;
  BtShared *pBt;
  Pager *pPVar4;
  MemPage *pMVar5;
  Wal *pWVar6;
  uint uVar7;
  uint uVar8;
  char cVar9;
  u8 uVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  MemPage *pPage1_1;
  BtLock *pBVar15;
  u16 uVar16;
  Btree *pBVar17;
  uint uVar18;
  Wal *pWVar19;
  uint uVar20;
  u8 *puVar21;
  uint uVar22;
  u32 uVar23;
  undefined1 auVar24 [16];
  MemPage *pPage1;
  int local_54;
  Btree *local_50;
  uint *local_48;
  u32 *local_40;
  MemPage *local_38;
  
  pBt = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if ((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) {
LAB_00135c17:
    if ((uint *)pSchemaVersion != (uint *)0x0) {
      uVar12 = *(uint *)(pBt->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    }
    uVar12 = 0;
    if (wrflag != 0) {
      pPVar4 = pBt->pPager;
      iVar13 = p->db->nSavepoint;
      if ((pPVar4->nSavepoint < iVar13) && (pPVar4->useJournal != '\0')) {
        uVar12 = pagerOpenSavepoint(pPVar4,iVar13);
      }
    }
    goto LAB_00135c58;
  }
  if (((p->db->flags & 0x2000000) != 0) && (pBt->pPager->readOnly == '\0')) {
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0xfe;
  }
  local_48 = (uint *)pSchemaVersion;
  if ((wrflag != 0) && (uVar12 = 8, (pBt->btsFlags & 1) != 0)) goto LAB_00135c58;
  cVar9 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar9 < '\0') goto LAB_00135604;
  }
  else if ((cVar9 < '\0') || (pBt->inTransaction == '\x02')) {
LAB_00135604:
    pBVar17 = pBt->pWriter;
LAB_00135608:
    uVar12 = 0x106;
    if (pBVar17->db != (sqlite3 *)0x0) goto LAB_00135c58;
  }
  else if (1 < wrflag) {
    for (pBVar15 = pBt->pLock; pBVar15 != (BtLock *)0x0; pBVar15 = pBVar15->pNext) {
      pBVar17 = pBVar15->pBtree;
      if (pBVar17 != p) goto LAB_00135608;
    }
  }
  uVar12 = querySharedCacheTableLock(p,1,'\x01');
  if (uVar12 == 0) {
    uVar2 = pBt->btsFlags;
    pBt->btsFlags = uVar2 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar2 | 0x10;
    }
    local_40 = &pBt->pageSize;
    uVar12 = 0;
    local_50 = p;
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        do {
          uVar12 = sqlite3PagerSharedLock(pBt->pPager);
          if ((uVar12 != 0) ||
             (uVar12 = btreeGetPage(pBt,1,&local_38,0), pMVar5 = local_38, uVar12 != 0))
          goto LAB_00135abd;
          puVar21 = local_38->aData;
          uVar12 = *(uint *)(puVar21 + 0x1c);
          uVar20 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                   uVar12 << 0x18;
          uVar14 = pBt->pPager->dbSize;
          if ((uVar20 == 0) || (*(int *)(puVar21 + 0x18) != *(int *)(puVar21 + 0x5c))) {
            uVar20 = uVar14;
          }
          if ((pBt->db->flags & 0x2000000) != 0) {
            uVar20 = 0;
          }
          if (uVar20 != 0) {
            auVar24[0] = -(*puVar21 == 'S');
            auVar24[1] = -(puVar21[1] == 'Q');
            auVar24[2] = -(puVar21[2] == 'L');
            auVar24[3] = -(puVar21[3] == 'i');
            auVar24[4] = -(puVar21[4] == 't');
            auVar24[5] = -(puVar21[5] == 'e');
            auVar24[6] = -(puVar21[6] == ' ');
            auVar24[7] = -(puVar21[7] == 'f');
            auVar24[8] = -(puVar21[8] == 'o');
            auVar24[9] = -(puVar21[9] == 'r');
            auVar24[10] = -(puVar21[10] == 'm');
            auVar24[0xb] = -(puVar21[0xb] == 'a');
            auVar24[0xc] = -(puVar21[0xc] == 't');
            auVar24[0xd] = -(puVar21[0xd] == ' ');
            auVar24[0xe] = -(puVar21[0xe] == '3');
            auVar24[0xf] = -(puVar21[0xf] == '\0');
            uVar22 = 0x1a;
            uVar12 = uVar22;
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
              if (2 < puVar21[0x12]) {
                *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
              }
              if (puVar21[0x13] < 3) {
                if ((puVar21[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                  local_54 = 0;
                  uVar12 = sqlite3PagerOpenWal(pBt->pPager,&local_54);
                  if (uVar12 == 0) {
                    if (local_54 != 0) goto LAB_001357bb;
                    releasePageOne((MemPage *)pMVar5->pDbPage);
                    goto LAB_00135938;
                  }
                }
                else {
LAB_001357bb:
                  uVar12 = uVar22;
                  if (puVar21[0x17] == ' ' && *(short *)(puVar21 + 0x15) == 0x2040) {
                    uVar8 = (uint)puVar21[0x10] * 0x100;
                    uVar7 = (uint)puVar21[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar7 + uVar8) - 0x10001) &&
                       (uVar18 = uVar7 | uVar8, ((uVar8 + uVar7) - 1 & uVar18) == 0)) {
                      *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                      bVar11 = puVar21[0x14];
                      uVar23 = uVar18 - bVar11;
                      if (uVar18 != pBt->pageSize) {
                        releasePageOne((MemPage *)pMVar5->pDbPage);
                        pBt->usableSize = uVar23;
                        pBt->pageSize = uVar18;
                        if (pBt->pTmpSpace != (u8 *)0x0) {
                          puVar21 = pBt->pTmpSpace + -4;
                          pBt->pTmpSpace = puVar21;
                          pcache1Free(puVar21);
                          pBt->pTmpSpace = (u8 *)0x0;
                        }
                        uVar12 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar11);
                        p = local_50;
                        if (uVar12 == 0) goto LAB_00135938;
                        goto LAB_00135abd;
                      }
                      if (((pBt->db->flags & 0x10000001) == 1) || (uVar20 <= uVar14)) {
                        if (0x1df < uVar23) {
                          pBt->pageSize = uVar18;
                          pBt->usableSize = uVar23;
                          uVar12 = *(uint *)(puVar21 + 0x34);
                          pBt->autoVacuum =
                               ((uVar12 >> 0x18 != 0 || (uVar12 & 0xff0000) != 0) ||
                               (uVar12 & 0xff00) != 0) || (uVar12 & 0xff) != 0;
                          uVar12 = *(uint *)(puVar21 + 0x40);
                          pBt->incrVacuum =
                               ((uVar12 >> 0x18 != 0 || (uVar12 & 0xff0000) != 0) ||
                               (uVar12 & 0xff00) != 0) || (uVar12 & 0xff) != 0;
                          goto LAB_00135876;
                        }
                      }
                      else {
                        uVar12 = 0xb;
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1033d,
                                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50"
                                   );
                      }
                    }
                  }
                }
              }
            }
            releasePageOne((MemPage *)pMVar5->pDbPage);
            pBt->pPage1 = (MemPage *)0x0;
            p = local_50;
            goto LAB_00135abd;
          }
          uVar23 = pBt->usableSize;
LAB_00135876:
          iVar13 = (uVar23 * 0x40 - 0x300) / 0xff - 0x17;
          pBt->maxLocal = (ushort)iVar13;
          uVar16 = (short)((uVar23 * 0x20 - 0x180) / 0xff) - 0x17;
          pBt->minLocal = uVar16;
          pBt->maxLeaf = (short)uVar23 - 0x23;
          pBt->minLeaf = uVar16;
          if (0x7e < (ushort)iVar13) {
            iVar13 = 0x7f;
          }
          pBt->max1bytePayload = (u8)iVar13;
          pBt->pPage1 = pMVar5;
          pBt->nPage = uVar20;
LAB_00135938:
          p = local_50;
        } while (pBt->pPage1 == (MemPage *)0x0);
        uVar12 = 0;
      }
      if ((wrflag == 0) || (uVar12 != 0)) {
LAB_00135a93:
        if (uVar12 == 0) {
          if ((p->inTrans == '\0') &&
             (pBt->nTransaction = pBt->nTransaction + 1, p->sharable != '\0')) {
            (p->lock).eLock = '\x01';
            (p->lock).pNext = pBt->pLock;
            pBt->pLock = &p->lock;
          }
          bVar11 = 2 - (wrflag == 0);
          p->inTrans = bVar11;
          if (pBt->inTransaction < bVar11) {
            pBt->inTransaction = bVar11;
          }
          pSchemaVersion = (int *)local_48;
          if (wrflag == 0) goto LAB_00135c17;
          pMVar5 = pBt->pPage1;
          pBt->pWriter = p;
          pBt->btsFlags = (ushort)(1 < wrflag) << 6 | pBt->btsFlags & 0xffbf;
          uVar12 = *(uint *)(pMVar5->aData + 0x1c);
          if (pBt->nPage ==
              (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18))
          goto LAB_00135c17;
          uVar12 = sqlite3PagerWrite(pMVar5->pDbPage);
          if (uVar12 == 0) {
            uVar12 = pBt->nPage;
            *(uint *)(pMVar5->aData + 0x1c) =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
            pSchemaVersion = (int *)local_48;
            goto LAB_00135c17;
          }
          break;
        }
LAB_00135abd:
        uVar10 = pBt->inTransaction;
      }
      else {
        uVar12 = 8;
        if ((pBt->btsFlags & 1) != 0) goto LAB_00135abd;
        pPVar4 = pBt->pPager;
        uVar14 = pPVar4->errCode;
        if (uVar14 == 0) {
          pPVar4->subjInMemory = p->db->temp_store == '\x02';
          if (pPVar4->eState != '\x01') {
LAB_00135a88:
            uVar12 = newDatabase(pBt);
            goto LAB_00135a93;
          }
          pWVar19 = pPVar4->pWal;
          if (pWVar19 == (Wal *)0x0) {
            uVar14 = pagerLockDb(pPVar4,2);
            if (uVar14 != 0 || wrflag < 2) {
LAB_00135a63:
              if (uVar14 != 0) goto LAB_0013569e;
LAB_00135a6b:
              pPVar4->eState = '\x02';
              PVar3 = pPVar4->dbSize;
              pPVar4->dbHintSize = PVar3;
              pPVar4->dbFileSize = PVar3;
              pPVar4->dbOrigSize = PVar3;
              pPVar4->journalOff = 0;
              goto LAB_00135a88;
            }
            do {
              uVar14 = pagerLockDb(pPVar4,4);
              if (uVar14 != 5) goto LAB_00135a63;
              iVar13 = (*pPVar4->xBusyHandler)(pPVar4->pBusyHandlerArg);
              uVar12 = 5;
            } while (iVar13 != 0);
          }
          else {
            if ((pPVar4->exclusiveMode != '\0') && (pWVar19->exclusiveMode == '\0')) {
              uVar14 = pagerLockDb(pPVar4,4);
              if (uVar14 != 0) goto LAB_0013569e;
              pWVar6 = pPVar4->pWal;
              pWVar19 = pWVar6;
              if (pWVar6->exclusiveMode == '\0') {
                (*pWVar6->pDbFd->pMethods->xShmLock)(pWVar6->pDbFd,pWVar6->readLock + 3,1,5);
                pWVar19 = pPVar4->pWal;
              }
              pWVar6->exclusiveMode = '\x01';
            }
            if (pWVar19->readOnly == '\0') {
              if ((pWVar19->exclusiveMode == '\0') &&
                 (uVar14 = (*pWVar19->pDbFd->pMethods->xShmLock)(pWVar19->pDbFd,0,1,10), uVar14 != 0
                 )) goto LAB_0013569e;
              pWVar19->writeLock = '\x01';
              iVar13 = bcmp(&pWVar19->hdr,*pWVar19->apWiData,0x30);
              if (iVar13 == 0) goto LAB_00135a6b;
              if (pWVar19->exclusiveMode == '\0') {
                (*pWVar19->pDbFd->pMethods->xShmLock)(pWVar19->pDbFd,0,1,9);
              }
              pWVar19->writeLock = '\0';
              goto LAB_001356ac;
            }
          }
          goto LAB_00135abd;
        }
LAB_0013569e:
        uVar12 = uVar14;
        if (uVar14 != 0x205) goto LAB_00135abd;
LAB_001356ac:
        uVar10 = pBt->inTransaction;
        uVar12 = (uint)(uVar10 != '\0') << 9 | 5;
      }
      if ((uVar10 == '\0') && (pMVar5 = pBt->pPage1, pMVar5 != (MemPage *)0x0)) {
        pBt->pPage1 = (MemPage *)0x0;
        releasePageOne((MemPage *)pMVar5->pDbPage);
      }
      if ((((char)uVar12 != '\x05') || (pBt->inTransaction != '\0')) ||
         (iVar13 = btreeInvokeBusyHandler(pBt), iVar13 == 0)) break;
    } while( true );
  }
LAB_00135c58:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return uVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase) 
   && sqlite3PagerIsreadonly(pBt->pPager)==0 
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction 
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerResetLockTimeout(pBt->pPager);

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}